

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void minMaxValueFinalize(sqlite3_context *context,int bValue)

{
  sqlite3_value *pValue;
  int in_ESI;
  sqlite3_value *pRes;
  undefined4 in_stack_fffffffffffffff0;
  
  pValue = (sqlite3_value *)sqlite3_aggregate_context((sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa,0);
  if (pValue != (sqlite3_value *)0x0) {
    if (pValue->flags != 0) {
      sqlite3_result_value((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),pValue);
    }
    if (in_ESI == 0) {
      sqlite3VdbeMemRelease((Mem *)0x226b7b);
    }
  }
  return;
}

Assistant:

static void minMaxValueFinalize(sqlite3_context *context, int bValue){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    if( bValue==0 ) sqlite3VdbeMemRelease(pRes);
  }
}